

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O2

void DrawerCommandQueue::ReportDrawerError
               (DrawerCommand *command,bool worker_thread,char *reason,bool fatal)

{
  undefined7 in_register_00000031;
  unique_lock<std::mutex> end_lock;
  unique_lock<std::mutex> local_50;
  FString local_40;
  FString local_38;
  FString local_30;
  FString local_28;
  
  if ((int)CONCAT71(in_register_00000031,worker_thread) != 0) {
    Instance();
    std::unique_lock<std::mutex>::unique_lock(&local_50,&Instance::queue.end_mutex);
    Instance();
    if ((*(int *)(Instance::queue.thread_error.Chars + -0xc) == 0) ||
       ((Instance(), fatal && (Instance::queue.thread_error_fatal == false)))) {
      FString::FString(&local_38,": ");
      operator+((char *)&local_30,(FString *)reason);
      (*command->_vptr_DrawerCommand[3])(&local_40,command);
      FString::operator+(&local_28,&local_30);
      Instance();
      FString::operator=(&Instance::queue.thread_error,&local_28);
      FString::~FString(&local_28);
      FString::~FString(&local_40);
      FString::~FString(&local_30);
      FString::~FString(&local_38);
      Instance();
      Instance::queue.thread_error_fatal = fatal;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_50);
    return;
  }
  if (fatal) {
    (*command->_vptr_DrawerCommand[3])(&local_50,command);
    I_FatalError("%s: %s",reason,local_50._M_device);
  }
  else {
    if (ReportDrawerError(DrawerCommand*,bool,char_const*,bool)::first != '\0') {
      ReportDrawerError(DrawerCommand*,bool,char_const*,bool)::first = '\x01';
      return;
    }
    (*command->_vptr_DrawerCommand[3])(&local_50,command);
    Printf("%s: %s\n",reason,local_50._M_device);
  }
  FString::~FString((FString *)&local_50);
  ReportDrawerError(DrawerCommand*,bool,char_const*,bool)::first = '\x01';
  return;
}

Assistant:

void DrawerCommandQueue::ReportDrawerError(DrawerCommand *command, bool worker_thread, const char *reason, bool fatal)
{
	if (worker_thread)
	{
		std::unique_lock<std::mutex> end_lock(Instance()->end_mutex);
		if (Instance()->thread_error.IsEmpty() || (!Instance()->thread_error_fatal && fatal))
		{
			Instance()->thread_error = reason + (FString)": " + command->DebugInfo();
			Instance()->thread_error_fatal = fatal;
		}
	}
	else
	{
		static bool first = true;
		if (fatal)
			I_FatalError("%s: %s", reason, command->DebugInfo().GetChars());
		else if (first)
			Printf("%s: %s\n", reason, command->DebugInfo().GetChars());
		first = false;
	}
}